

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_test.c
# Opt level: O0

int LowMC_test_vector_129_129_4_4(void)

{
  int iVar1;
  uint8_t ciphertext_expected [17];
  uint8_t plaintext [17];
  uint8_t key [17];
  uint7 in_stack_ffffffffffffffd9;
  uint8_t *in_stack_ffffffffffffffe0;
  
  iVar1 = lowmc_enc((lowmc_parameters_t *)0xb87e2d538834f330,in_stack_ffffffffffffffe0,
                    (uint8_t *)((ulong)in_stack_ffffffffffffffd9 << 8),(uint8_t *)0x789ff4a91d89c76a
                   );
  return iVar1;
}

Assistant:

static int LowMC_test_vector_129_129_4_4(void) {
  const uint8_t key[17] = {
      0x30, 0xf3, 0x34, 0x88, 0x53, 0x2d, 0x7e, 0xb8, 0xa5,
      0xf8, 0xfb, 0x4f, 0x2e, 0x63, 0xba, 0x56, 0x0,
  };
  const uint8_t plaintext[17] = {
      0xc2, 0x6a, 0x5d, 0xf9, 0x6,  0x15, 0x8d, 0xcb, 0x6a,
      0xc7, 0x89, 0x1d, 0xa9, 0xf4, 0x9f, 0x78, 0x0,
  };
  const uint8_t ciphertext_expected[17] = {
      0xb,  0x43, 0xb6, 0x5f, 0x7c, 0x53, 0x50, 0x6,  0xcf,
      0x27, 0xe8, 0x6f, 0x55, 0x1b, 0xd0, 0x15, 0x80,
  };

  return lowmc_enc(&parameters_129_129_4, key, plaintext, ciphertext_expected);
}